

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluateTest.hpp
# Opt level: O2

void Qentem::Test::TestEvaluate18(QTest *test)

{
  unsigned_long_long local_58;
  QNumber64 number;
  Value<char> value;
  
  number.Natural = 0xffffffffffffffff;
  value.field_0.array_.storage_ = (Value<char> *)0x0;
  value.field_0._8_8_ = 0;
  value.type_ = Undefined;
  Value<char>::operator+=(&value,2);
  Value<char>::operator+=(&value,3);
  Value<char>::operator+=(&value,-2);
  Value<char>::operator+=(&value,-3);
  Value<char>::operator+=(&value,4.0);
  Value<char>::operator+=(&value,-4.0);
  number = TestEvaluate("{var:0}%{var:0}",&value);
  local_58 = 0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x10df);
  number = TestEvaluate("{var:0}%{var:1}",&value);
  local_58 = 2;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x10e3);
  number = TestEvaluate("{var:0}%{var:2}",&value);
  local_58 = 0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x10e7);
  number = TestEvaluate("{var:0}%{var:3}",&value);
  local_58 = 2;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x10eb);
  number = TestEvaluate("{var:0}%{var:4}",&value);
  local_58 = 2;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x10ef);
  number = TestEvaluate("{var:0}%{var:5}",&value);
  local_58 = 2;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x10f3);
  number = TestEvaluate("{var:1}%{var:0}",&value);
  local_58 = 1;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x10f9);
  number = TestEvaluate("{var:1}%{var:1}",&value);
  local_58 = 0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x10fd);
  number = TestEvaluate("{var:1}%{var:2}",&value);
  local_58 = 1;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x1101);
  number = TestEvaluate("{var:1}%{var:3}",&value);
  local_58 = 0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x1105);
  number = TestEvaluate("{var:1}%{var:4}",&value);
  local_58 = 3;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x1109);
  number = TestEvaluate("{var:1}%{var:5}",&value);
  local_58 = 3;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x110d);
  number = TestEvaluate("{var:2}%{var:0}",&value);
  local_58 = 0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x1113);
  number = TestEvaluate("{var:2}%{var:1}",&value);
  local_58 = CONCAT44(local_58._4_4_,0xfffffffe);
  QTest::IsEqual<long_long,int>(test,&number.Integer,(int *)&local_58,0x1117);
  number = TestEvaluate("{var:2}%{var:2}",&value);
  local_58 = 0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x111b);
  number = TestEvaluate("{var:2}%{var:3}",&value);
  local_58._0_4_ = 0xfffffffe;
  QTest::IsEqual<long_long,int>(test,&number.Integer,(int *)&local_58,0x111f);
  number = TestEvaluate("{var:2}%{var:4}",&value);
  local_58._0_4_ = 0xfffffffe;
  QTest::IsEqual<long_long,int>(test,&number.Integer,(int *)&local_58,0x1123);
  number = TestEvaluate("{var:2}%{var:5}",&value);
  local_58._0_4_ = 0xfffffffe;
  QTest::IsEqual<long_long,int>(test,&number.Integer,(int *)&local_58,0x1127);
  number = TestEvaluate("{var:3}%{var:0}",&value);
  local_58 = CONCAT44(local_58._4_4_,0xffffffff);
  QTest::IsEqual<long_long,int>(test,&number.Integer,(int *)&local_58,0x112d);
  number = TestEvaluate("{var:3}%{var:1}",&value);
  local_58 = 0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x1131);
  number = TestEvaluate("{var:3}%{var:2}",&value);
  local_58 = CONCAT44(local_58._4_4_,0xffffffff);
  QTest::IsEqual<long_long,int>(test,&number.Integer,(int *)&local_58,0x1135);
  number = TestEvaluate("{var:3}%{var:3}",&value);
  local_58 = 0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x1139);
  number = TestEvaluate("{var:3}%{var:4}",&value);
  local_58._0_4_ = 0xfffffffd;
  QTest::IsEqual<long_long,int>(test,&number.Integer,(int *)&local_58,0x113d);
  number = TestEvaluate("{var:3}%{var:5}",&value);
  local_58 = CONCAT44(local_58._4_4_,0xfffffffd);
  QTest::IsEqual<long_long,int>(test,&number.Integer,(int *)&local_58,0x1141);
  number = TestEvaluate("{var:4}%{var:0}",&value);
  local_58 = 0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x1147);
  number = TestEvaluate("{var:4}%{var:1}",&value);
  local_58 = 1;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x114b);
  number = TestEvaluate("{var:4}%{var:2}",&value);
  local_58 = 0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x114f);
  number = TestEvaluate("{var:4}%{var:3}",&value);
  local_58 = 1;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x1153);
  number = TestEvaluate("{var:4}%{var:4}",&value);
  local_58 = 0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x1157);
  number = TestEvaluate("{var:4}%{var:5}",&value);
  local_58 = 0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x115b);
  number = TestEvaluate("{var:5}%{var:0}",&value);
  local_58 = 0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x1161);
  number = TestEvaluate("{var:5}%{var:1}",&value);
  local_58 = CONCAT44(local_58._4_4_,0xffffffff);
  QTest::IsEqual<long_long,int>(test,&number.Integer,(int *)&local_58,0x1165);
  number = TestEvaluate("{var:5}%{var:2}",&value);
  local_58 = 0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x1169);
  number = TestEvaluate("{var:5}%{var:3}",&value);
  local_58 = CONCAT44(local_58._4_4_,0xffffffff);
  QTest::IsEqual<long_long,int>(test,&number.Integer,(int *)&local_58,0x116d);
  number = TestEvaluate("{var:5}%{var:4}",&value);
  local_58 = 0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x1171);
  number = TestEvaluate("{var:5}%{var:5}",&value);
  local_58 = 0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x1175);
  number = TestEvaluate("{var:1}%{var:0}",&value);
  local_58 = 1;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x117b);
  number = TestEvaluate("{var:2}%{var:0}",&value);
  local_58 = 0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x117f);
  number = TestEvaluate("{var:3}%{var:0}",&value);
  local_58 = CONCAT44(local_58._4_4_,0xffffffff);
  QTest::IsEqual<long_long,int>(test,&number.Integer,(int *)&local_58,0x1183);
  number = TestEvaluate("{var:4}%{var:0}",&value);
  local_58 = 0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x1187);
  number = TestEvaluate("{var:5}%{var:0}",&value);
  local_58 = 0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x118b);
  number = TestEvaluate("{var:0}%{var:1}",&value);
  local_58 = 2;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x1191);
  number = TestEvaluate("{var:2}%{var:1}",&value);
  local_58 = CONCAT44(local_58._4_4_,0xfffffffe);
  QTest::IsEqual<long_long,int>(test,&number.Integer,(int *)&local_58,0x1195);
  number = TestEvaluate("{var:3}%{var:1}",&value);
  local_58 = 0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x1199);
  number = TestEvaluate("{var:4}%{var:1}",&value);
  local_58 = 1;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x119d);
  number = TestEvaluate("{var:5}%{var:1}",&value);
  local_58 = CONCAT44(local_58._4_4_,0xffffffff);
  QTest::IsEqual<long_long,int>(test,&number.Integer,(int *)&local_58,0x11a1);
  number = TestEvaluate("{var:0}%{var:2}",&value);
  local_58 = 0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x11a7);
  number = TestEvaluate("{var:1}%{var:2}",&value);
  local_58 = 1;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x11ab);
  number = TestEvaluate("{var:3}%{var:2}",&value);
  local_58 = CONCAT44(local_58._4_4_,0xffffffff);
  QTest::IsEqual<long_long,int>(test,&number.Integer,(int *)&local_58,0x11af);
  number = TestEvaluate("{var:4}%{var:2}",&value);
  local_58 = 0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x11b3);
  number = TestEvaluate("{var:5}%{var:2}",&value);
  local_58 = 0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x11b7);
  number = TestEvaluate("{var:0}%{var:3}",&value);
  local_58 = 2;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x11bd);
  number = TestEvaluate("{var:1}%{var:3}",&value);
  local_58 = 0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x11c1);
  number = TestEvaluate("{var:2}%{var:3}",&value);
  local_58 = CONCAT44(local_58._4_4_,0xfffffffe);
  QTest::IsEqual<long_long,int>(test,&number.Integer,(int *)&local_58,0x11c5);
  number = TestEvaluate("{var:4}%{var:3}",&value);
  local_58 = 1;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x11c9);
  number = TestEvaluate("{var:5}%{var:3}",&value);
  local_58 = CONCAT44(local_58._4_4_,0xffffffff);
  QTest::IsEqual<long_long,int>(test,&number.Integer,(int *)&local_58,0x11cd);
  number = TestEvaluate("{var:0}%{var:4}",&value);
  local_58 = 2;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x11d3);
  number = TestEvaluate("{var:1}%{var:4}",&value);
  local_58 = 3;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x11d7);
  number = TestEvaluate("{var:2}%{var:4}",&value);
  local_58._0_4_ = 0xfffffffe;
  QTest::IsEqual<long_long,int>(test,&number.Integer,(int *)&local_58,0x11db);
  number = TestEvaluate("{var:3}%{var:4}",&value);
  local_58 = CONCAT44(local_58._4_4_,0xfffffffd);
  QTest::IsEqual<long_long,int>(test,&number.Integer,(int *)&local_58,0x11df);
  number = TestEvaluate("{var:5}%{var:4}",&value);
  local_58 = 0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x11e3);
  number = TestEvaluate("{var:0}%{var:5}",&value);
  local_58 = 2;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x11e9);
  number = TestEvaluate("{var:1}%{var:5}",&value);
  local_58 = 3;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x11ed);
  number = TestEvaluate("{var:2}%{var:5}",&value);
  local_58._0_4_ = 0xfffffffe;
  QTest::IsEqual<long_long,int>(test,&number.Integer,(int *)&local_58,0x11f1);
  number = TestEvaluate("{var:3}%{var:5}",&value);
  local_58 = CONCAT44(local_58._4_4_,0xfffffffd);
  QTest::IsEqual<long_long,int>(test,&number.Integer,(int *)&local_58,0x11f5);
  number = TestEvaluate("{var:4}%{var:5}",&value);
  local_58 = 0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>(test,&number.Natural,&local_58,0x11f9);
  Value<char>::~Value(&value);
  return;
}

Assistant:

static void TestEvaluate18(QTest &test) {
    Value<char> value;
    QNumber64   number{-1};
    const char *content;

    value += 2U;
    value += 3U;
    value += -2;
    value += -3;
    value += 4.0F;
    value += -4.0F;

    content = "{var:0}%{var:0}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:0}%{var:1}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 2ULL, __LINE__);

    content = "{var:0}%{var:2}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:0}%{var:3}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 2ULL, __LINE__);

    content = "{var:0}%{var:4}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 2ULL, __LINE__);

    content = "{var:0}%{var:5}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 2ULL, __LINE__);

    //////////////////

    content = "{var:1}%{var:0}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "{var:1}%{var:1}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:1}%{var:2}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "{var:1}%{var:3}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:1}%{var:4}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 3ULL, __LINE__);

    content = "{var:1}%{var:5}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 3ULL, __LINE__);

    //////////////////

    content = "{var:2}%{var:0}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:2}%{var:1}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -2, __LINE__);

    content = "{var:2}%{var:2}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:2}%{var:3}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -2, __LINE__);

    content = "{var:2}%{var:4}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -2, __LINE__);

    content = "{var:2}%{var:5}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -2, __LINE__);

    //////////////////

    content = "{var:3}%{var:0}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -1, __LINE__);

    content = "{var:3}%{var:1}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:3}%{var:2}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -1, __LINE__);

    content = "{var:3}%{var:3}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:3}%{var:4}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -3, __LINE__);

    content = "{var:3}%{var:5}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -3, __LINE__);

    //////////

    content = "{var:4}%{var:0}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:4}%{var:1}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "{var:4}%{var:2}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:4}%{var:3}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "{var:4}%{var:4}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:4}%{var:5}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    //////////

    content = "{var:5}%{var:0}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:5}%{var:1}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -1, __LINE__);

    content = "{var:5}%{var:2}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:5}%{var:3}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -1, __LINE__);

    content = "{var:5}%{var:4}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:5}%{var:5}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    ////////////////////////////////////////

    content = "{var:1}%{var:0}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "{var:2}%{var:0}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:3}%{var:0}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -1, __LINE__);

    content = "{var:4}%{var:0}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:5}%{var:0}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    //////////////////

    content = "{var:0}%{var:1}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 2ULL, __LINE__);

    content = "{var:2}%{var:1}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -2, __LINE__);

    content = "{var:3}%{var:1}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:4}%{var:1}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "{var:5}%{var:1}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -1, __LINE__);

    //////////////////

    content = "{var:0}%{var:2}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:1}%{var:2}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "{var:3}%{var:2}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -1, __LINE__);

    content = "{var:4}%{var:2}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:5}%{var:2}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    //////////////////

    content = "{var:0}%{var:3}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 2ULL, __LINE__);

    content = "{var:1}%{var:3}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:2}%{var:3}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -2, __LINE__);

    content = "{var:4}%{var:3}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "{var:5}%{var:3}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -1, __LINE__);

    //////////

    content = "{var:0}%{var:4}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 2ULL, __LINE__);

    content = "{var:1}%{var:4}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 3ULL, __LINE__);

    content = "{var:2}%{var:4}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -2, __LINE__);

    content = "{var:3}%{var:4}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -3, __LINE__);

    content = "{var:5}%{var:4}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    //////////

    content = "{var:0}%{var:5}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 2ULL, __LINE__);

    content = "{var:1}%{var:5}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 3ULL, __LINE__);

    content = "{var:2}%{var:5}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -2, __LINE__);

    content = "{var:3}%{var:5}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -3, __LINE__);

    content = "{var:4}%{var:5}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);
}